

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall clipp::parser::parser(parser *this,group *root,arg_index offset)

{
  int in_EDX;
  pointer in_RSI;
  dfs_traverser *in_RDI;
  group *cur;
  pointer this_00;
  pointer *action;
  group *in_stack_ffffffffffffffc8;
  scoped_dfs_traverser *in_stack_ffffffffffffffd0;
  
  (in_RDI->stack_).
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RSI;
  detail::scoped_dfs_traverser::scoped_dfs_traverser
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(int *)&in_RDI[7].stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start = in_EDX + -1;
  *(undefined4 *)
   ((long)&in_RDI[7].stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  cur = (group *)0x0;
  this_00 = (pointer)0x0;
  in_RDI[7].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[7].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[8].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::vector
            ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
             0x18d6ef);
  action = &in_RDI[8].stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  in_RDI[8].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)cur;
  in_RDI[8].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = this_00;
  in_RDI[9].stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::vector
            ((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
              *)0x18d71f);
  *(undefined1 *)
   &in_RDI[9].stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  group::depth_first_traverser::depth_first_traverser((depth_first_traverser *)this_00,cur);
  for_each_potential_miss<clipp::parser::for_each_potential_miss(clipp::group_const&,int)::_lambda(clipp::group::depth_first_traverser_const&)_1_>
            (in_RDI,(anon_class_8_1_8991fb9c *)action);
  group::depth_first_traverser::~depth_first_traverser((depth_first_traverser *)0x18d761);
  return;
}

Assistant:

explicit
    parser(const group& root, arg_index offset = 0):
        root_{&root}, pos_{root},
        index_{offset-1}, eaten_{0},
        args_{}, missCand_{}, blocked_{false}
    {
        for_each_potential_miss(dfs_traverser{root},
            [this](const dfs_traverser& p){
                missCand_.emplace_back(p, index_);
            });
    }